

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManPropagate2(Cbs2_Man_t *p,int Level)

{
  int *piVar1;
  ulong *puVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  int local_54;
  int local_4c;
  
  iVar17 = (p->pProp).iHead;
  lVar23 = (long)iVar17;
  iVar9 = (p->pProp).iTail;
  if ((iVar17 < iVar9) && (uVar12 = (p->pProp).pData[lVar23], uVar12 != 0)) {
    do {
      if ((int)uVar12 < 0) {
LAB_0071629f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      if ((p->vWatches).nSize <= (int)uVar12) {
LAB_00716280:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar10 = (p->vWatches).pArray;
      iVar17 = piVar10[uVar12];
      if (iVar17 != 0) {
        uVar22 = uVar12 ^ 1;
        piVar10 = piVar10 + uVar12;
        do {
          piVar5 = (p->pClauses).pData;
          piVar1 = piVar5 + iVar17;
          iVar9 = *piVar1;
          p->nPropCalls[1] = p->nPropCalls[1] + 1;
          if (piVar1[1] == uVar22) {
            piVar1[1] = piVar1[2];
            piVar1[2] = uVar22;
            puVar2 = (ulong *)(piVar1 + (long)iVar9 + 1);
            *puVar2 = *puVar2 << 0x20 | *puVar2 >> 0x20;
          }
          if (piVar1[2] != uVar22) {
            __assert_fail("pLits[1] == LitF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x350,"int Cbs2_ManPropagateClauses(Cbs2_Man_t *, int, int)");
          }
          uVar16 = piVar1[1];
          if ((int)uVar16 < 0) goto LAB_007161c6;
          iVar4 = (p->vAssign).nSize;
          if (iVar4 <= (int)(uVar16 >> 1)) goto LAB_007161a7;
          pcVar6 = (p->vAssign).pArray;
          cVar3 = pcVar6[uVar16 >> 1];
          if ((uVar16 & 1 ^ (int)cVar3) == 1) {
            piVar10 = piVar1 + (long)*piVar1 + 2;
            bVar8 = false;
          }
          else {
            if (2 < iVar9) {
              lVar20 = 0;
              do {
                uVar14 = piVar5[(long)iVar17 + lVar20 + 3];
                if ((int)uVar14 < 0) goto LAB_007161c6;
                if (iVar4 <= (int)(uVar14 >> 1)) goto LAB_007161a7;
                if ((uVar14 & 1) != (int)pcVar6[uVar14 >> 1]) {
                  piVar5[(long)iVar17 + 2] = uVar14;
                  piVar1[lVar20 + 3] = uVar22;
                  *piVar10 = piVar1[(long)piVar5[iVar17] + 2];
                  uVar16 = piVar5[(long)iVar17 + 2];
                  if ((int)uVar16 < 0) goto LAB_0071629f;
                  uVar21 = (ulong)uVar16 ^ 1;
                  if ((p->vWatches).nSize <= (int)uVar21) goto LAB_00716280;
                  piVar5 = (p->vWatches).pArray;
                  if (piVar5[uVar21] == 0) {
                    Vec_IntPush(&p->vWatchUpds,(int)uVar21);
                  }
                  if ((piVar1[1] != uVar16) && (piVar1[2] != uVar16)) {
                    __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                                  ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
                  }
                  piVar7 = (p->pClauses).pData;
                  piVar7[(int)((uint)(piVar1[2] == uVar16) + iVar17 + 1 + piVar7[iVar17])] =
                       piVar5[uVar21];
                  piVar5[uVar21] = iVar17;
                  goto LAB_00715f6e;
                }
                lVar20 = lVar20 + 1;
              } while ((long)iVar9 + -2 != lVar20);
            }
            if (cVar3 < '\x02') {
              if ((uVar16 & 1) == (int)cVar3) {
                p->nClauseConf = p->nClauseConf + 1;
                if (piVar1[1] < 0) goto LAB_007161c6;
                local_54 = Cbs2_ManAnalyze(p,Level,(uint)piVar1[1] >> 1,0,iVar17);
                bVar8 = true;
              }
              else {
LAB_00715f6e:
                bVar8 = false;
              }
            }
            else {
              Cbs2_ManAssign(p,uVar16,Level,0,iVar17);
              piVar10 = (p->pClauses).pData + iVar17;
              piVar10 = piVar10 + (long)*piVar10 + 2;
              bVar8 = false;
            }
          }
          iVar17 = local_54;
          if (bVar8) goto LAB_00715f9d;
          iVar17 = *piVar10;
        } while (iVar17 != 0);
      }
      iVar17 = 0;
LAB_00715f9d:
      if (iVar17 != 0) {
        return iVar17;
      }
      uVar12 = uVar12 >> 1;
      if ((p->vFanout0).nSize <= (int)uVar12) {
LAB_00716204:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar10 = (p->vFanout0).pArray;
      uVar22 = uVar12;
      while (uVar22 = piVar10[uVar22], uVar22 != 0) {
        if ((int)uVar22 < 0) {
LAB_007161c6:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar16 = uVar22 >> 1;
        iVar17 = (p->vAssign).nSize;
        if (iVar17 <= (int)uVar16) goto LAB_007161a7;
        pcVar6 = (p->vAssign).pArray;
        if (pcVar6[uVar16] < '\x02') {
          iVar17 = Cbs2_ManPropagateOne(p,uVar16,Level);
          if (iVar17 == 0) goto LAB_00716122;
          bVar8 = false;
          local_4c = iVar17;
        }
        else {
          if (p->pAig->nObjs <= (int)uVar16) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar11 = p->pAig->pObjs + uVar16;
          if (((ulong)pGVar11 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x434,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
          }
          uVar21 = *(ulong *)pGVar11;
          uVar14 = (uint)uVar21;
          if (((int)uVar14 < 0) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x435,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
          }
          uVar14 = uVar16 - (uVar14 & 0x1fffffff);
          if (((int)uVar14 < 0) || (iVar17 <= (int)uVar14)) {
LAB_007161a7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          uVar19 = (uint)(uVar21 >> 0x20);
          uVar18 = uVar16 - (uVar19 & 0x1fffffff);
          if (((int)uVar18 < 0) || (iVar17 <= (int)uVar18)) goto LAB_007161a7;
          uVar13 = (uint)pcVar6[uVar14];
          uVar15 = (uint)(uVar21 >> 0x1d) & 1;
          uVar18 = (uint)pcVar6[uVar18];
          uVar14 = uVar19 >> 0x1d & 1;
          p->nPropCalls[2] = p->nPropCalls[2] + 1;
          if ((uVar15 == uVar13) && (uVar14 == uVar18)) {
            uVar14 = uVar22 | 1;
LAB_007160b3:
            uVar18 = (uint)*(ulong *)pGVar11;
            iVar17 = uVar16 - ((uint)(*(ulong *)pGVar11 >> 0x20) & 0x1fffffff);
          }
          else {
            if (uVar15 == uVar13) {
              uVar18 = *(uint *)pGVar11;
            }
            else {
              if (uVar14 != uVar18) {
                if (((uVar15 ^ uVar13) != 1) || ((uVar14 ^ uVar18) != 1)) goto LAB_00716122;
                uVar14 = uVar22 & 0x7ffffffe;
                goto LAB_007160b3;
              }
              uVar18 = *(uint *)&pGVar11->field_0x4;
            }
            uVar14 = uVar22 | 1;
            iVar17 = 0;
          }
          Cbs2_ManAssign(p,uVar14,Level,uVar16 - (uVar18 & 0x1fffffff),iVar17);
LAB_00716122:
          bVar8 = true;
        }
        if (!bVar8) {
          return local_4c;
        }
        if ((p->vFanoutN).nSize <= (int)uVar22) goto LAB_00716204;
        piVar10 = (p->vFanoutN).pArray;
      }
      iVar17 = Cbs2_ManPropagateOne(p,uVar12,Level);
      if (iVar17 != 0) {
        return iVar17;
      }
      lVar23 = lVar23 + 1;
      iVar9 = (p->pProp).iTail;
    } while ((lVar23 < iVar9) && (uVar12 = (p->pProp).pData[lVar23], uVar12 != 0));
  }
  (p->pProp).iHead = iVar9;
  return 0;
}

Assistant:

int Cbs2_ManPropagate2( Cbs2_Man_t * p, int Level )
{
    int i, iLit, iFan, hClause;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        if ( (hClause = Cbs2_ManPropagateClauses(p, Level, iLit)) )
            return hClause;
        Cbs2_ObjForEachFanout( p, Abc_Lit2Var(iLit), iFan )
        {
            int iFanout = Abc_Lit2Var(iFan);
            if ( !Cbs2_VarIsAssigned(p, iFanout) )
                Cbs2_ManPropagateUnassigned( p, iFanout, Level );
            else if ( (hClause = Cbs2_ManPropagateOne(p, iFanout, Level)) )
                return hClause;
        }
        if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
            return hClause;
    }
    p->pProp.iHead = p->pProp.iTail;
    return 0;
}